

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58 =
       0x842750;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x40 =
       0x842840;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xe0 =
       0x842778;
  this[-1].super_IfcStructuralActivity.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x8427a0;
  this[-1].super_IfcStructuralActivity.GlobalOrLocal.field_2._M_allocated_capacity = 0x8427c8;
  *(undefined8 *)&this[-1].field_0x158 = 0x8427f0;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject = 0x842818;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__00842858);
  operator_delete(this_00,400);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}